

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# input.c
# Opt level: O3

uchar * glfwGetJoystickButtons(int jid,int *count)

{
  ulong uVar1;
  GLFWbool GVar2;
  int iVar3;
  
  *count = 0;
  if (_glfw.initialized == 0) {
    _glfwInputError(0x10001,(char *)0x0);
  }
  else {
    uVar1 = (ulong)(uint)jid;
    if ((uint)jid < 0x10) {
      GVar2 = initJoysticks();
      if (((GVar2 != 0) && (_glfw.joysticks[uVar1].present != 0)) &&
         (iVar3 = _glfwPlatformPollJoystick(_glfw.joysticks + uVar1,2), iVar3 != 0)) {
        iVar3 = _glfw.joysticks[uVar1].buttonCount;
        if (_glfw.hints.init.hatButtons != 0) {
          iVar3 = iVar3 + _glfw.joysticks[uVar1].hatCount * 4;
        }
        *count = iVar3;
        return _glfw.joysticks[uVar1].buttons;
      }
    }
    else {
      _glfwInputError(0x10003,"Invalid joystick ID %i",uVar1);
    }
  }
  return (uchar *)0x0;
}

Assistant:

char* glfwGetJoystickButtons(int jid, int* count)
{
    _GLFWjoystick* js;

    assert(jid >= GLFW_JOYSTICK_1);
    assert(jid <= GLFW_JOYSTICK_LAST);
    assert(count != NULL);

    *count = 0;

    _GLFW_REQUIRE_INIT_OR_RETURN(NULL);

    if (jid < 0 || jid > GLFW_JOYSTICK_LAST)
    {
        _glfwInputError(GLFW_INVALID_ENUM, "Invalid joystick ID %i", jid);
        return NULL;
    }

    if (!initJoysticks())
        return NULL;

    js = _glfw.joysticks + jid;
    if (!js->present)
        return NULL;

    if (!_glfwPlatformPollJoystick(js, _GLFW_POLL_BUTTONS))
        return NULL;

    if (_glfw.hints.init.hatButtons)
        *count = js->buttonCount + js->hatCount * 4;
    else
        *count = js->buttonCount;

    return js->buttons;
}